

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

tchar_t * tcsncpy_s(tchar_t *Out,size_t OutLen,tchar_t *In,size_t n)

{
  size_t sVar1;
  size_t local_40;
  size_t local_38;
  ulong local_30;
  size_t n_local;
  tchar_t *In_local;
  size_t OutLen_local;
  tchar_t *Out_local;
  
  if (In == (tchar_t *)0x0) {
    __assert_fail("In != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/str/str.c"
                  ,0x6c,"tchar_t *tcsncpy_s(tchar_t *, size_t, const tchar_t *, size_t)");
  }
  if (OutLen != 0) {
    sVar1 = strlen(In);
    local_30 = n;
    if (sVar1 <= n) {
      local_30 = strlen(In);
    }
    if (OutLen - 1 < local_30) {
      local_38 = OutLen - 1;
    }
    else {
      sVar1 = strlen(In);
      local_40 = n;
      if (sVar1 <= n) {
        local_40 = strlen(In);
      }
      local_38 = local_40;
    }
    memcpy(Out,In,local_38);
    Out[local_38] = '\0';
  }
  return Out;
}

Assistant:

tchar_t* tcsncpy_s(tchar_t* Out,size_t OutLen,const tchar_t* In,size_t n)
{
    assert(In != NULL);
	if (OutLen>0)
	{
		n = MIN(MIN(tcslen(In),n),OutLen-1);
		memcpy(Out,In,n*sizeof(tchar_t));
		Out[n] = 0;
	}
    return Out;
}